

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O3

bool __thiscall lddgraph::removefile(lddgraph *this,string *file)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = remove((file->_M_dataplus)._M_p);
  if ((iVar1 != 0) && (this->_quiet == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Unable to delete file ",0x1d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return iVar1 == 0;
}

Assistant:

bool removefile(const string & file)
    {
      if (remove(file.c_str()) != 0)
      {
        if (!_quiet)
          cerr << "Error: Unable to delete file " << file << endl;
        return false;
      }
      return true;
    }